

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O2

void cmCMakePresetsErrors::INVALID_VARIABLE(Value *value,cmJSONState *state)

{
  cmJSONState *in_RDX;
  string var;
  string sStack_58;
  string local_38;
  
  getVariableName_abi_cxx11_(&local_38,(cmCMakePresetsErrors *)state,in_RDX);
  cmStrCat<char_const(&)[15],std::__cxx11::string&>
            (&sStack_58,(char (*) [15])"Invalid CMake ",&local_38);
  cmJSONState::AddErrorAtValue(state,&sStack_58,value);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void INVALID_VARIABLE(const Json::Value* value, cmJSONState* state)
{
  std::string var = cmCMakePresetsErrors::getVariableName(state);
  state->AddErrorAtValue(cmStrCat("Invalid CMake ", var), value);
}